

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

void __thiscall
wabt::Stream::WriteMemoryDump
          (Stream *this,void *start,size_t size,size_t offset,PrintChars print_chars,char *prefix,
          char *desc)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte c;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  
  pbVar4 = (byte *)(size + (long)start);
  pbVar5 = (byte *)start;
  while (pbVar5 < pbVar4) {
    if (prefix != (char *)0x0) {
      Writef(this,"%s",prefix);
    }
    Writef(this,"%07zx: ",pbVar5 + (offset - (long)start));
    pbVar6 = pbVar5;
    while (pbVar6 < pbVar5 + 0x10) {
      for (lVar7 = 0; pbVar1 = pbVar6 + lVar7, (int)lVar7 != 2; lVar7 = lVar7 + 1) {
        if (pbVar1 < pbVar4) {
          Writef(this,"%02x",(ulong)*pbVar1);
        }
        else {
          WriteU8(this,0x20,(char *)0x0,No);
          WriteU8(this,0x20,(char *)0x0,No);
        }
      }
      WriteU8(this,0x20,(char *)0x0,No);
      pbVar6 = pbVar1;
    }
    if (print_chars == Yes) {
      WriteU8(this,0x20,(char *)0x0,No);
      for (lVar7 = 0; (pbVar6 = pbVar5 + lVar7, (uint)lVar7 < 0x10 && (pbVar6 < pbVar4));
          lVar7 = lVar7 + 1) {
        bVar2 = *pbVar6;
        iVar3 = isprint((uint)bVar2);
        c = 0x2e;
        if (iVar3 != 0) {
          c = bVar2;
        }
        WriteChar(this,c,(char *)0x0,No);
      }
    }
    if ((desc != (char *)0x0) && (pbVar4 <= pbVar6)) {
      Writef(this,"  ; %s",desc);
    }
    WriteU8(this,10,(char *)0x0,No);
    pbVar5 = pbVar6;
  }
  return;
}

Assistant:

void Stream::WriteMemoryDump(const void* start,
                             size_t size,
                             size_t offset,
                             PrintChars print_chars,
                             const char* prefix,
                             const char* desc) {
  const uint8_t* p = static_cast<const uint8_t*>(start);
  const uint8_t* end = p + size;
  while (p < end) {
    const uint8_t* line = p;
    const uint8_t* line_end = p + DUMP_OCTETS_PER_LINE;
    if (prefix) {
      Writef("%s", prefix);
    }
    Writef("%07" PRIzx ": ", reinterpret_cast<intptr_t>(p) -
                                 reinterpret_cast<intptr_t>(start) + offset);
    while (p < line_end) {
      for (int i = 0; i < DUMP_OCTETS_PER_GROUP; ++i, ++p) {
        if (p < end) {
          Writef("%02x", *p);
        } else {
          WriteChar(' ');
          WriteChar(' ');
        }
      }
      WriteChar(' ');
    }

    if (print_chars == PrintChars::Yes) {
      WriteChar(' ');
      p = line;
      for (int i = 0; i < DUMP_OCTETS_PER_LINE && p < end; ++i, ++p)
        WriteChar(isprint(*p) ? *p : '.');
    }

    /* if there are multiple lines, only print the desc on the last one */
    if (p >= end && desc) {
      Writef("  ; %s", desc);
    }
    WriteChar('\n');
  }
}